

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

int __thiscall ON_PolyCurve::FindNextGap(ON_PolyCurve *this,int segment_index0)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  if (segment_index0 < 0) {
LAB_00584e29:
    iVar3 = 0;
  }
  else {
    iVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    do {
      iVar3 = segment_index0 + 1;
      if (iVar1 <= iVar3) goto LAB_00584e29;
      bVar2 = HasGapAt(this,segment_index0);
      segment_index0 = iVar3;
    } while (!bVar2);
  }
  return iVar3;
}

Assistant:

int ON_PolyCurve::FindNextGap(int segment_index0) const
{
  if ( segment_index0 >= 0 )
  {
    const int count = m_segment.Count();
    for (int gap_index = segment_index0+1; gap_index < count; gap_index++ )
    {
      if ( HasGapAt(gap_index-1) )
        return gap_index;
    }
  }
  return 0;
}